

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::build_multimethod_initializers(CTcGenTarg *this)

{
  vm_obj_id_t vVar1;
  CTcSymFuncBase *this_00;
  CTcSymObj *this_01;
  size_t sVar2;
  void *__buf;
  void *__buf_00;
  tct3_method_gen_ctx *ctx;
  CTcGenTarg *pCVar3;
  char *pcVar4;
  CTcSymbol *local_80;
  int local_78;
  tct3_tadsobj_ctx obj_ctx;
  tct3_method_gen_ctx genctx;
  
  local_78 = 0;
  local_80 = CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodRegister",0x14);
  sVar2 = 0;
  open_method(G_cg,G_cs_static,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0,(CTPNCodeBody *)0x0,
              (CTcPrsSymtab *)0x0,0,0,0,0,0,0,&genctx);
  CTcPrsSymtab::enum_entries(G_prs->global_symtab_,multimethod_init_cb,&local_80);
  if (local_78 == 0) {
LAB_001e4aa6:
    ctx = &genctx;
    close_method(G_cg,0,(CTcPrsSymtab *)0x0,(CTcTokFileDesc *)0x0,0,ctx,(CTcNamedArgTab *)0x0);
    close_method_cleanup(G_cg,ctx);
    if (local_78 != 0) {
      if ((local_80 == (CTcSymbol *)0x0) ||
         (*(int *)&(local_80->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                   field_0x24 != 1)) {
        pcVar4 = "_multiMethodRegister";
        goto LAB_001e4bf8;
      }
      vVar1 = G_cg->next_obj_;
      G_cg->next_obj_ = vVar1 + 1;
      this->mminit_obj_ = vVar1;
      pCVar3 = (CTcGenTarg *)G_prs->global_symtab_;
      this_01 = (CTcSymObj *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)ctx);
      CTcSymObj::CTcSymObj
                (this_01,"<multiMethodInit>",0x11,0,this->mminit_obj_,1,TC_META_TADSOBJ,
                 (CTcDictEntry *)0x0);
      (**(code **)(*(long *)pCVar3 + 0x18))(pCVar3,this_01);
      sVar2 = (size_t)this->mminit_obj_;
      open_tadsobj(pCVar3,&obj_ctx,G_os,this->mminit_obj_,0,1,0,0);
      CTcDataStream::write2(G_os,1);
      CTcDataStream::write(G_os,0xb,__buf_00,sVar2);
      CTcAbsFixup::add_abs_fixup
                (&((genctx.anchor)->fixup_info_).internal_fixup_head_,G_os,G_os->ofs_);
      pCVar3 = (CTcGenTarg *)G_os;
      CTcDataStream::write4(G_os,0);
      close_tadsobj(pCVar3,&obj_ctx);
    }
    G_cs = G_cs_main;
  }
  else {
    this_00 = (CTcSymFuncBase *)
              CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodBuildBindings",0x19);
    if ((this_00 != (CTcSymFuncBase *)0x0) &&
       (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                 super_CVmHashEntry.field_0x24 == 1)) {
      write_op(G_cg,'X');
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,sVar2);
      CTcSymFuncBase::add_abs_fixup(this_00,&G_cs->super_CTcDataStream);
      CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
      goto LAB_001e4aa6;
    }
    pcVar4 = "_multiMethodBuildBindings";
LAB_001e4bf8:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,pcVar4);
  }
  return;
}

Assistant:

void CTcGenTarg::build_multimethod_initializers()
{
    tct3_method_gen_ctx genctx;
    mminit_ctx ctx;

    /* look up the _multiMethodRegister function */
    ctx.mmr = (CTcSymFunc *)G_prs->get_global_symtab()->find(
        "_multiMethodRegister", 20);

    /* 
     *   open the method - it's a static initializer, so write it to the
     *   static stream 
     */
    G_cg->open_method(G_cs_static, 0, 0, 0, 0, 0, 0, FALSE,
                      FALSE, FALSE, FALSE, &genctx);

    /* scan the symbol table for multimethods and generate initializers */
    G_prs->get_global_symtab()->enum_entries(&multimethod_init_cb, &ctx);

    /* 
     *   if we found any multi-methods, generate a call to
     *   _multiMethodBuildBindings 
     */
    if (ctx.cnt != 0)
    {
        /* look up the function - it's an error if it's not defined */
        CTcSymFunc *mmb = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            "_multiMethodBuildBindings", 25);
        if (mmb == 0 || mmb->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodBuildBindings");
            return;
        }

        /* write the call instruction */
        G_cg->write_op(OPC_CALL);
        G_cs->write(0);                                   /* argument count */
        mmb->add_abs_fixup(G_cs);                 /* function address fixup */
        G_cs->write4(0);                               /* fixup placeholder */
    }

    /* close the method and clean up */
    G_cg->close_method(0, 0, 0, 0, &genctx, 0);
    G_cg->close_method_cleanup(&genctx);

    /* 
     *   if we generated any registrations, create the initializer object -
     *   this will go in the static initializer block to trigger invocation
     *   of the registration routine at load time 
     */
    if (ctx.cnt != 0)
    {
        /* we have multi-methods, so we definitely need _multiMethodRegister */
        if (ctx.mmr == 0 || ctx.mmr->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodRegister");
            return;
        }

        /* create an anonymous object to hold the initializer code */
        mminit_obj_ = G_cg->new_obj_id();

        /* add a debugging symbol for it */
        G_prs->get_global_symtab()->add_entry(new CTcSymObj(
            "<multiMethodInit>", 17, FALSE, mminit_obj_, TRUE,
            TC_META_TADSOBJ, 0));

        /* write the object header: no superclasses, 1 property */
        tct3_tadsobj_ctx obj_ctx;
        open_tadsobj(&obj_ctx, G_os, mminit_obj_, 0, 1, 0, 0);
        
        /* write the static initializer property */
        G_os->write2(1);                           /* arbitrary property ID */
        G_os->write(VM_CODEOFS);    /* offset of the code we just generated */
        CTcAbsFixup::add_abs_fixup(
            &genctx.anchor->fixup_info_.internal_fixup_head_,
            G_os, G_os->get_ofs());
        G_os->write4(0);                                     /* placeholder */
        
        /* fix up the object size data */
        close_tadsobj(&obj_ctx);
    }

    /* switch back to the main stream */
    G_cs = G_cs_main;
}